

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O3

void tcu::astc::generateBlockCaseTestData
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *dst,
               CompressedTexFormat format,BlockTestType testType)

{
  bool bVar1;
  bool bVar2;
  deFloat16 dVar3;
  deFloat16 dVar4;
  deFloat16 dVar5;
  deFloat16 dVar6;
  ISEMode IVar7;
  ISEMode IVar8;
  int iVar9;
  uint uVar10;
  ISEParams IVar11;
  ISEParams IVar12;
  long lVar13;
  ulong uVar14;
  byte bVar15;
  int iVar16;
  uint *__result;
  uint *iseInputs_00;
  deUint32 *pdVar17;
  NormalBlockISEInputs *pNVar18;
  uint uVar19;
  int blockHeight;
  int blockHeight_00;
  int blockHeight_01;
  int blockHeight_02;
  int iVar20;
  int extraout_EDX;
  int blockHeight_03;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong uVar21;
  ulong extraout_RDX_02;
  int blockNdx;
  uint uVar22;
  int iVar23;
  ISEMode IVar24;
  uint uVar25;
  ISEParams IVar26;
  deUint32 partitionSeed;
  deUint32 dVar27;
  NormalBlockISEInputs *pNVar28;
  NormalBlockISEInputs *pNVar29;
  deUint32 singleCem;
  ulong uVar30;
  int weightGridWidth;
  int iVar31;
  uint uVar32;
  long lVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int numColorEndpoints;
  IVec3 blockSize;
  NormalBlockISEInputs iseInputs;
  ulong local_d10;
  NormalBlockISEInputs *local_d00;
  NormalBlockParams local_ce8;
  AssignBlock128 local_ca8;
  undefined1 local_c98 [16];
  ISEParams local_c88;
  ulong local_c80;
  ISEParams local_c78;
  int local_c6c;
  int local_c68;
  ISEParams local_c60;
  ISEParams local_c58;
  undefined8 local_c50;
  ISEParams local_c48;
  BlockTestType local_c3c;
  NormalBlockISEInputs local_c38;
  
  getBlockPixelSize((tcu *)&local_c6c,format);
  iseInputs_00 = &switchD_019ce6bc::switchdataD_01cd4b60;
  switch(testType) {
  case BLOCK_TEST_TYPE_VOID_EXTENT_LDR:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(dst,0x20000);
    uVar30 = 0;
    do {
      iVar31 = (int)(uVar30 * 0x80041 >> 0x20);
      uVar22 = ((uint)((int)uVar30 - iVar31) >> 1) + iVar31 >> 0xc;
      local_c38.weight.value._4_8_ =
           (ulong)(uVar22 - 0x4000) << 0x30 |
           (CONCAT44(uVar22,uVar22 * 0x10000 + (uVar22 & 0xffff) + 0x40000000) ^ 0x800000000000) &
           0xffffffffffff;
      local_c38.weight._0_8_ = 0xfffffffffffffdfc;
      anon_unknown_0::AssignBlock128::pushBytesToVector((AssignBlock128 *)&local_c38,dst);
      uVar22 = (int)uVar30 + 0xffff;
      uVar30 = (ulong)uVar22;
    } while (uVar22 != 0x1fffe000);
    break;
  case BLOCK_TEST_TYPE_VOID_EXTENT_HDR:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(dst,0x20000);
    uVar22 = 0;
    do {
      dVar3 = deFloat32To16(((float)(int)uVar22 * 131008.0) / 8191.0 + -65504.0);
      dVar4 = deFloat32To16((float)((uVar22 + 0x800 & 0x1fff) * 0x1ffc0) / 8191.0 + -65504.0);
      dVar5 = deFloat32To16(((float)(int)(uVar22 ^ 0x1000) * 131008.0) / 8191.0 + -65504.0);
      dVar6 = deFloat32To16((float)((uVar22 + 0x1800 & 0x1fff) * 0x1ffc0) / 8191.0 + -65504.0);
      local_c38.weight.value._4_8_ = CONCAT26(dVar6,CONCAT24(dVar5,CONCAT22(dVar4,dVar3)));
      local_c38.weight._0_8_ = 0xfffffffffffffffc;
      anon_unknown_0::AssignBlock128::pushBytesToVector((AssignBlock128 *)&local_c38,dst);
      uVar22 = uVar22 + 1;
    } while (uVar22 != 0x2000);
    break;
  case BLOCK_TEST_TYPE_WEIGHT_GRID:
    bVar2 = false;
    bVar34 = true;
    do {
      bVar1 = bVar34;
      pNVar29 = (NormalBlockISEInputs *)0x0;
      do {
        local_c98._0_8_ = pNVar29;
        IVar11 = *(ISEParams *)(&(anonymous_namespace)::s_weightISEParamsCandidates + (long)pNVar29)
        ;
        iVar31 = 2;
        do {
          iVar9 = 2;
          do {
            local_ce8.isMultiPartSingleCemMode = false;
            local_ce8.partitionSeed = 0xffffffff;
            local_ce8.colorEndpointModes[3] = 0;
            local_ce8.colorEndpointModes[1] = 0;
            local_ce8.colorEndpointModes[2] = 0;
            local_ce8.weightGridHeight = iVar9;
            local_ce8.weightGridWidth = iVar31;
            local_ce8.ccs = 0;
            local_ce8.numPartitions = 1;
            local_ce8.colorEndpointModes[0] = 0;
            local_ce8.weightISEParams = IVar11;
            local_ce8.isDualPlane = bVar2;
            bVar34 = anon_unknown_0::isValidBlockParams(&local_ce8,local_c6c,local_c68);
            if (bVar34) {
              anon_unknown_0::generateDefaultISEInputs(&local_c38,&local_ce8);
              local_ca8 = anon_unknown_0::generateNormalBlock
                                    (&local_ce8,(int)&local_c38,blockHeight,pNVar29);
              anon_unknown_0::AssignBlock128::pushBytesToVector(&local_ca8,dst);
            }
            iVar9 = iVar9 + 1;
          } while (iVar9 != 0xd);
          iVar31 = iVar31 + 1;
        } while (iVar31 != 0xd);
        pNVar29 = (NormalBlockISEInputs *)(local_c98._0_8_ + 1);
      } while (pNVar29 != (NormalBlockISEInputs *)0xc);
      bVar2 = true;
      bVar34 = false;
    } while (bVar1);
    break;
  case BLOCK_TEST_TYPE_WEIGHT_ISE:
    local_c80 = 0;
    do {
      iVar9 = local_c68;
      iVar31 = local_c6c;
      local_ce8.isMultiPartSingleCemMode = false;
      local_ce8.partitionSeed = 0xffffffff;
      local_ce8.colorEndpointModes[3] = 0;
      local_ce8.colorEndpointModes[1] = 0;
      local_ce8.colorEndpointModes[2] = 0;
      local_ce8.weightGridWidth = 4;
      local_ce8.weightGridHeight = 4;
      IVar11 = *(ISEParams *)(&(anonymous_namespace)::s_weightISEParamsCandidates + local_c80);
      local_ce8.isDualPlane = true;
      local_ce8.ccs = 0;
      local_ce8.numPartitions = 1;
      local_ce8.colorEndpointModes[0] = 0;
      local_ce8.weightISEParams = IVar11;
      bVar34 = anon_unknown_0::isValidBlockParams(&local_ce8,local_c6c,local_c68);
      uVar22 = 0x20;
      if (!bVar34) {
        iVar20 = 8;
        iVar16 = 3;
        do {
          iVar23 = iVar16;
          local_ce8.weightGridHeight = iVar23;
          local_ce8.weightGridWidth = iVar23;
          bVar34 = anon_unknown_0::isValidBlockParams(&local_ce8,iVar31,iVar9);
          iVar20 = iVar20 + -2;
          iVar16 = iVar23 + -1;
        } while (!bVar34);
        uVar22 = iVar20 * iVar23;
      }
      IVar8 = IVar11.mode;
      IVar24 = (IVar8 == ISEMODE_QUINT) + 1 + (uint)(IVar8 == ISEMODE_QUINT);
      if (IVar8 == ISEMODE_TRIT) {
        IVar24 = 5;
      }
      if (IVar8 == ISEMODE_PLAIN_BIT) {
        iVar31 = 1;
LAB_019ced56:
        iVar31 = iVar31 << ((byte)IVar11.numBits & 0x1f);
      }
      else {
        if (IVar8 == ISEMODE_QUINT) {
          iVar31 = 5;
          goto LAB_019ced56;
        }
        iVar31 = 0;
        if (IVar8 == ISEMODE_TRIT) {
          iVar31 = 3;
          goto LAB_019ced56;
        }
      }
      iVar9 = (iVar31 / (int)uVar22 + 1) - (uint)(iVar31 % (int)uVar22 == 0);
      anon_unknown_0::generateDefaultISEInputs(&local_c38,&local_ce8);
      local_c38.weight._0_8_ = local_c38.weight._0_8_ & 0xffffffffffffff00;
      pNVar29 = (NormalBlockISEInputs *)((ulong)uVar22 - 1);
      auVar38._8_4_ = (int)pNVar29;
      auVar38._0_8_ = pNVar29;
      auVar38._12_4_ = (int)((ulong)pNVar29 >> 0x20);
      IVar7 = ISEMODE_TRIT;
      uVar10 = 1;
      auVar38 = auVar38 ^ _DAT_019f5ce0;
      uVar30 = extraout_RDX;
      auVar37 = _DAT_019f5ce0;
      local_c98 = auVar38;
      do {
        if (0 < iVar9) {
          iVar16 = 0;
          uVar19 = uVar10;
          do {
            iVar20 = (int)uVar30;
            if (0 < (int)uVar22) {
              pNVar29 = (NormalBlockISEInputs *)(ulong)uVar19;
              lVar13 = 0;
              auVar35 = _DAT_019fcc00;
              do {
                auVar36 = auVar35 ^ auVar37;
                iVar23 = (int)pNVar29;
                if ((bool)(~(auVar38._4_4_ < auVar36._4_4_ ||
                            auVar38._0_4_ < auVar36._0_4_ && auVar36._4_4_ == auVar38._4_4_) & 1)) {
                  uVar21 = (long)(iVar23 + -1) % (long)iVar31;
                  uVar30 = uVar21 & 0xffffffff;
                  *(int *)((long)&local_c38.weight.value + lVar13) = (int)uVar21;
                }
                if (auVar36._12_4_ <= auVar38._12_4_ &&
                    (auVar36._8_4_ <= auVar38._8_4_ || auVar36._12_4_ != auVar38._12_4_)) {
                  uVar30 = (long)iVar23 % (long)iVar31 & 0xffffffff;
                  *(int *)((long)&local_c38.weight.value + lVar13 + 4) =
                       (int)((long)iVar23 % (long)iVar31);
                }
                iVar20 = (int)uVar30;
                lVar33 = auVar35._8_8_;
                auVar35._0_8_ = auVar35._0_8_ + 2;
                auVar35._8_8_ = lVar33 + 2;
                lVar13 = lVar13 + 8;
                pNVar29 = (NormalBlockISEInputs *)(ulong)(iVar23 + 2);
              } while ((ulong)uVar22 * 4 != lVar13);
            }
            local_ca8 = anon_unknown_0::generateNormalBlock
                                  (&local_ce8,(int)&local_c38,iVar20,pNVar29);
            anon_unknown_0::AssignBlock128::pushBytesToVector(&local_ca8,dst);
            iVar16 = iVar16 + 1;
            uVar19 = uVar19 + uVar22;
            uVar30 = extraout_RDX_00;
            auVar37 = _DAT_019f5ce0;
            auVar38 = local_c98;
          } while (iVar16 != iVar9);
        }
        IVar7 = IVar7 + ISEMODE_QUINT;
        uVar10 = uVar10 + 1;
      } while (IVar7 != IVar24);
      if (IVar8 < ISEMODE_PLAIN_BIT) {
        anon_unknown_0::generateDefaultISEInputs(&local_c38,&local_ce8);
        local_c38.weight.isGivenInBlockForm = true;
        uVar10 = (uint)(IVar8 == ISEMODE_TRIT) * 0x80 + 0x80;
        uVar22 = ((int)uVar22 / (int)IVar24 + 1) - (uint)((int)uVar22 % (int)IVar24 == 0);
        uVar30 = (long)(ulong)uVar10 % (long)(int)uVar22;
        uVar21 = uVar30 & 0xffffffff;
        local_c88 = (ISEParams)((ulong)local_c88 & 0xffffffff00000000);
        iVar31 = ((int)((long)(ulong)uVar10 / (long)(int)uVar22) + 1) - (uint)((int)uVar30 == 0);
        do {
          if (0 < iVar31) {
            iVar9 = 0;
            pNVar29 = (NormalBlockISEInputs *)((ulong)local_c88 & 0xffffffff);
            local_d10 = (ulong)local_c88 & 0xffffffff;
            do {
              iVar16 = (int)uVar21;
              local_c98._0_4_ = iVar9;
              if (0 < (int)uVar22) {
                lVar13 = 0;
                iVar9 = (int)local_d10;
                do {
                  memset((void *)((long)&local_c38.weight.value + lVar13 + 4),0,(ulong)(IVar24 * 4))
                  ;
                  iVar16 = iVar9 % (int)uVar10;
                  *(int *)((long)&local_c38.weight.value + lVar13) = iVar16;
                  lVar13 = lVar13 + 0x18;
                  iVar9 = iVar9 + 1;
                } while ((ulong)uVar22 * 0x18 != lVar13);
              }
              local_ca8 = anon_unknown_0::generateNormalBlock
                                    (&local_ce8,(int)&local_c38,iVar16,pNVar29);
              anon_unknown_0::AssignBlock128::pushBytesToVector(&local_ca8,dst);
              iVar9 = local_c98._0_4_ + 1;
              local_d10 = (ulong)((int)local_d10 + uVar22);
              uVar21 = extraout_RDX_01;
            } while (iVar9 != iVar31);
          }
          IVar8 = local_c88.mode + ISEMODE_QUINT;
          local_c88.mode = IVar8;
        } while (IVar8 != IVar24);
      }
      local_c80 = local_c80 + 1;
    } while (local_c80 != 0xc);
    break;
  case BLOCK_TEST_TYPE_CEMS:
    IVar11 = (ISEParams)(local_ce8.colorEndpointModes + 1);
    uVar30 = CONCAT71((int7)((ulong)((long)&switchD_019ce6bc::switchdataD_01cd4b60 +
                                    (long)(int)(&switchD_019ce6bc::switchdataD_01cd4b60)[testType])
                            >> 8),1);
    local_d00 = (NormalBlockISEInputs *)0x0;
    do {
      local_c60.mode = (ISEMode)uVar30;
      uVar30 = uVar30 & 0xff | 4;
      local_c78.mode = (int)uVar30;
      local_c78.numBits = (int)(uVar30 >> 0x20);
      uVar30 = 1;
      lVar13 = 0;
      do {
        local_c80 = CONCAT44(local_c80._4_4_,1);
        if (1 < uVar30) {
          dVar27 = 0;
          do {
            iVar9 = local_c68;
            iVar31 = local_c6c;
            local_ce8.colorEndpointModes[3] = 0;
            local_ce8.colorEndpointModes[1] = 0;
            local_ce8.colorEndpointModes[2] = 0;
            local_ce8.weightGridWidth = 4;
            local_ce8.weightGridHeight = 4;
            local_ce8._20_8_ = uVar30 << 0x20;
            local_ce8.isMultiPartSingleCemMode = true;
            local_ce8.partitionSeed = 0x27a;
            lVar33 = 0;
            pNVar29 = local_d00;
            local_ce8.isDualPlane = SUB81(local_d00,0);
            local_ce8.colorEndpointModes[0] = dVar27;
            do {
              local_ce8.weightISEParams =
                   *(ISEParams *)
                    ((long)&(anonymous_namespace)::s_weightISEParamsCandidates + lVar33);
              bVar34 = anon_unknown_0::isValidBlockParams(&local_ce8,iVar31,iVar9);
              if (bVar34) {
                anon_unknown_0::generateDefaultISEInputs(&local_c38,&local_ce8);
                local_ca8 = anon_unknown_0::generateNormalBlock
                                      (&local_ce8,(int)&local_c38,blockHeight_00,pNVar29);
                anon_unknown_0::AssignBlock128::pushBytesToVector(&local_ca8,dst);
                break;
              }
              lVar33 = lVar33 + 8;
            } while (lVar33 != 0x60);
            dVar27 = dVar27 + 1;
          } while (dVar27 != 0x10);
          local_c80 = CONCAT44(local_c80._4_4_,0x10);
        }
        local_c88 = (ISEParams)(local_ce8.colorEndpointModes + uVar30);
        uVar22 = 0;
        do {
          dVar27 = 0;
          do {
            auVar36._8_8_ = 0;
            auVar36._0_8_ = local_c98._8_8_;
            local_c98 = auVar36 << 0x40;
            do {
              uVar10 = 0;
              do {
                iVar9 = local_c68;
                iVar31 = local_c6c;
                pdVar17 = local_ce8.colorEndpointModes;
                local_ce8.weightGridWidth = 4;
                local_ce8.weightGridHeight = 4;
                local_ce8._20_8_ = uVar30 << 0x20;
                local_ce8.isMultiPartSingleCemMode = false;
                local_ce8.colorEndpointModes[0] = uVar22;
                local_ce8.colorEndpointModes[1] = dVar27;
                local_ce8.colorEndpointModes[2] = local_c98._0_4_;
                local_ce8.colorEndpointModes[3] = uVar10;
                local_ce8.partitionSeed = 0x27a;
                lVar33 = lVar13;
                IVar12 = (ISEParams)pdVar17;
                IVar26 = IVar11;
                uVar19 = uVar22;
                if (IVar11 != local_c88) {
                  do {
                    if (*(uint *)IVar26 < uVar19) {
                      IVar12 = IVar26;
                      uVar19 = *(uint *)IVar26;
                    }
                    lVar33 = lVar33 + -4;
                    IVar26 = (ISEParams)((long)IVar26 + 4);
                  } while (lVar33 != 0);
                  uVar19 = *(uint *)IVar12;
                  lVar33 = 0;
                  uVar25 = uVar22;
                  do {
                    uVar32 = *(uint *)((long)local_ce8.colorEndpointModes + lVar33 + 4);
                    bVar34 = uVar25 < uVar32;
                    if (uVar25 <= uVar32) {
                      uVar25 = uVar32;
                    }
                    if (bVar34) {
                      pdVar17 = (deUint32 *)((long)IVar11 + lVar33);
                    }
                    lVar33 = lVar33 + 4;
                  } while (lVar13 != lVar33);
                }
                uVar19 = (*pdVar17 >> 2) - (uVar19 >> 2);
                pNVar29 = (NormalBlockISEInputs *)(ulong)uVar19;
                if (uVar19 < 2) {
                  lVar33 = 0;
                  local_ce8.isDualPlane = SUB81(local_d00,0);
                  do {
                    local_ce8.weightISEParams =
                         *(ISEParams *)
                          ((long)&(anonymous_namespace)::s_weightISEParamsCandidates + lVar33);
                    bVar34 = anon_unknown_0::isValidBlockParams(&local_ce8,iVar31,iVar9);
                    if (bVar34) {
                      anon_unknown_0::generateDefaultISEInputs(&local_c38,&local_ce8);
                      local_ca8 = anon_unknown_0::generateNormalBlock
                                            (&local_ce8,(int)&local_c38,blockHeight_01,pNVar29);
                      anon_unknown_0::AssignBlock128::pushBytesToVector(&local_ca8,dst);
                      break;
                    }
                    lVar33 = lVar33 + 8;
                  } while (lVar33 != 0x60);
                }
                auVar37 = local_c98;
              } while ((3 < uVar30) && (bVar34 = uVar10 < 0xf, uVar10 = uVar10 + 1, bVar34));
              if (uVar30 < 3) break;
              uVar10 = local_c98._0_4_;
              local_c98._4_4_ = 0;
              local_c98._0_4_ = uVar10 + 1;
              local_c98._8_8_ = auVar37._8_8_;
            } while (uVar10 < 0xf);
            dVar27 = dVar27 + 1;
          } while (dVar27 != (deUint32)local_c80);
          uVar22 = uVar22 + 1;
        } while (uVar22 != 0x10);
        uVar30 = uVar30 + 1;
        lVar13 = lVar13 + 4;
      } while ((ISEParams)uVar30 != local_c78);
      local_d00 = (NormalBlockISEInputs *)CONCAT71((uint7)(uint3)(dVar27 >> 8),1);
      uVar30 = 0;
    } while (((ulong)local_c60 & 1) != 0);
    break;
  case BLOCK_TEST_TYPE_PARTITION_SEED:
    local_ce8.numPartitions = 2;
    do {
      dVar27 = 0;
      local_c98._0_4_ = local_ce8.numPartitions;
      do {
        local_ce8.colorEndpointModes[3] = 0;
        local_ce8.colorEndpointModes[1] = 0;
        local_ce8.colorEndpointModes[2] = 0;
        local_ce8.weightGridWidth = 4;
        local_ce8.weightGridHeight = 4;
        local_ce8.weightISEParams.mode = ISEMODE_PLAIN_BIT;
        local_ce8.weightISEParams.numBits = 2;
        local_ce8.isDualPlane = false;
        local_ce8.ccs = 0xffffffff;
        local_ce8.isMultiPartSingleCemMode = true;
        local_ce8.colorEndpointModes[0] = 0;
        local_ce8.partitionSeed = dVar27;
        anon_unknown_0::generateDefaultISEInputs(&local_c38,&local_ce8);
        local_ca8 = anon_unknown_0::generateNormalBlock
                              (&local_ce8,(int)&local_c38,blockHeight_02,
                               (NormalBlockISEInputs *)iseInputs_00);
        anon_unknown_0::AssignBlock128::pushBytesToVector(&local_ca8,dst);
        dVar27 = dVar27 + 1;
        local_ce8.numPartitions = local_c98._0_4_;
      } while (dVar27 != 0x400);
      local_ce8.numPartitions = local_c98._0_4_ + 1;
    } while (local_ce8.numPartitions != 5);
    break;
  case BLOCK_TEST_TYPE_ENDPOINT_VALUE_LDR:
  case BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_NO_15:
  case BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_15:
    uVar22 = 0;
    local_c3c = testType;
    do {
      uVar10 = uVar22 & 0xe;
      if ((testType != BLOCK_TEST_TYPE_ENDPOINT_VALUE_LDR) ||
         (uVar10 != 0xe && ((uVar22 != 0xb && uVar22 != 7) && uVar10 != 2))) {
        if ((testType != BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_15 || uVar22 == 0xf) &&
           (testType != BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_NO_15 ||
            uVar22 != 0xf && (uVar10 == 0xe || ((uVar22 == 0xb || uVar22 == 7) || uVar10 == 2)))) {
          local_ce8.isMultiPartSingleCemMode = false;
          local_ce8.partitionSeed = 0xffffffff;
          local_ce8.colorEndpointModes[3] = 0;
          local_ce8.colorEndpointModes[1] = 0;
          local_ce8.colorEndpointModes[2] = 0;
          local_ce8.weightGridWidth = 3;
          local_ce8.weightGridHeight = 4;
          local_ce8.weightISEParams.mode = ISEMODE_PLAIN_BIT;
          local_ce8.weightISEParams.numBits = 2;
          local_ce8.isDualPlane = false;
          local_ce8.ccs = 0xffffffff;
          local_ce8.numPartitions = 1;
          uVar10 = (uVar22 >> 1 & 6) + 2;
          local_ce8.colorEndpointModes[0] = uVar22;
          IVar11 = anon_unknown_0::computeMaximumRangeISEParams(0x57,uVar10);
          IVar24 = IVar11.mode;
          local_c50 = CONCAT44(local_c50._4_4_,uVar22);
          if (IVar24 == ISEMODE_PLAIN_BIT) {
            uVar19 = ~(-1 << ((byte)IVar11.numBits & 0x1f));
          }
          else {
            if (IVar24 == ISEMODE_QUINT) {
              iVar31 = 5;
            }
            else {
              uVar19 = 0xffffffff;
              if (IVar24 != ISEMODE_TRIT) goto LAB_019ce7e2;
              iVar31 = 3;
            }
            uVar19 = (iVar31 << ((byte)IVar11.numBits & 0x1f)) - 1;
          }
LAB_019ce7e2:
          uVar25 = uVar19 + 1;
          if (9 < (int)(uVar19 + 1)) {
            uVar25 = 10;
          }
          uVar30 = (ulong)uVar25;
          iVar31 = uVar25 - 1;
          local_c78.numBits = 0;
          local_c78.mode = uVar10;
          local_c48.numBits = 0;
          local_c48.mode = (uVar22 >> 1 & 0x3ffffffe) + 2;
          local_c58.mode = ISEMODE_QUINT;
          local_c58.numBits = 0;
          local_c60.mode = ISEMODE_TRIT;
          local_c60.numBits = 0;
          local_c80 = uVar30;
          do {
            IVar12 = (ISEParams)((long)local_c60 + 1);
            IVar11 = local_c58;
            local_c88 = local_c60;
            local_c60 = IVar12;
            if ((ulong)IVar12 < (ulong)local_c78) {
              do {
                anon_unknown_0::generateDefaultISEInputs(&local_c38,&local_ce8);
                if (uVar19 < 0x7fffffff) {
                  iVar9 = 0;
                  do {
                    IVar12 = local_c88;
                    local_c98._0_4_ = (int)(iVar9 * uVar19) / iVar31;
                    iVar16 = 0;
                    do {
                      *(undefined4 *)((long)&local_c38.endpoint.value + (long)IVar12 * 4) =
                           local_c98._0_4_;
                      *(int *)((long)&local_c38.endpoint.value + (long)IVar11 * 4) = iVar16 / iVar31
                      ;
                      local_ca8 = anon_unknown_0::generateNormalBlock
                                            (&local_ce8,(int)&local_c38,iVar16 % iVar31,
                                             (NormalBlockISEInputs *)(ulong)(uint)local_c98._0_4_);
                      anon_unknown_0::AssignBlock128::pushBytesToVector(&local_ca8,dst);
                      iVar16 = iVar16 + uVar19;
                      uVar22 = (int)uVar30 - 1;
                      uVar30 = (ulong)uVar22;
                    } while (uVar22 != 0);
                    iVar9 = iVar9 + 1;
                    uVar30 = local_c80;
                  } while (iVar9 != (int)local_c80);
                }
                IVar11 = (ISEParams)((long)IVar11 + 1);
              } while ((ulong)IVar11 < (ulong)local_c78);
            }
            local_c58 = (ISEParams)((long)local_c58 + 1);
          } while (local_c60 != local_c48);
          uVar22 = (uint)local_c50;
          testType = local_c3c;
        }
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 != 0x10);
    break;
  case BLOCK_TEST_TYPE_ENDPOINT_ISE:
    local_c88.mode = ISEMODE_TRIT;
    local_c88.numBits = 0;
LAB_019cf417:
    iVar31 = local_c68;
    local_c98._0_4_ = local_c6c;
    pNVar29 = (NormalBlockISEInputs *)0x8;
    uVar22 = 1;
LAB_019cf43b:
    local_c50 = 0xffffffe3;
    if (uVar22 == 1) {
      local_c50 = 0xffffffef;
    }
    uVar10 = uVar22 * 8;
    bVar34 = false;
LAB_019cf460:
    local_c80 = CONCAT44(local_c80._4_4_,(int)local_c50 + ((byte)~bVar34 & 1) * 2 + 0x7e);
    uVar30 = 0;
LAB_019cf48c:
    IVar11 = *(ISEParams *)(&(anonymous_namespace)::s_weightISEParamsCandidates + uVar30);
    local_c78 = (ISEParams)((ulong)IVar11 >> 0x20);
    IVar24 = 4;
    uVar19 = 2;
    local_c48 = (ISEParams)uVar30;
LAB_019cf4b9:
    uVar25 = 1;
    local_c60.mode = IVar24;
LAB_019cf4c5:
    uVar25 = uVar25 + 1;
    local_ce8.colorEndpointModes[3] = 0;
    local_ce8.colorEndpointModes[1] = 0;
    local_ce8.colorEndpointModes[2] = 0;
    local_ce8.weightGridHeight = uVar25;
    local_ce8.weightGridWidth = uVar19;
    local_ce8._20_8_ = (ulong)uVar22 << 0x20;
    local_ce8.isMultiPartSingleCemMode = true;
    local_ce8.colorEndpointModes[0] = 0xc;
    local_ce8.partitionSeed = 0x27a;
    local_ce8.weightISEParams = IVar11;
    local_ce8.isDualPlane = bVar34;
    bVar2 = anon_unknown_0::isValidBlockParams(&local_ce8,local_c98._0_4_,iVar31);
    if (!bVar2) goto LAB_019cf640;
    iVar9 = IVar24 << bVar34;
    IVar8 = IVar11.mode;
    if (IVar8 == ISEMODE_PLAIN_BIT) {
      iVar16 = iVar9 * local_c78.mode;
    }
    else {
      if (IVar8 == ISEMODE_QUINT) {
        iVar16 = (iVar9 * 7) / 3;
        bVar2 = iVar9 * -0x55555553 + 0x2aaaaaaaU < 0x55555555;
      }
      else {
        iVar16 = -1;
        if (IVar8 != ISEMODE_TRIT) goto LAB_019cf5d5;
        iVar16 = (iVar9 * 8) / 5;
        bVar2 = iVar9 * 0x66666668 + 0x19999999U < 0x33333333;
      }
      iVar16 = ((iVar16 + 1) - (uint)bVar2) + iVar9 * local_c78.mode;
    }
LAB_019cf5d5:
    IVar12 = anon_unknown_0::computeMaximumRangeISEParams((deUint32)local_c80 - iVar16,uVar10);
    IVar8 = IVar12.mode;
    bVar15 = (byte)IVar12.numBits;
    if (IVar8 == ISEMODE_PLAIN_BIT) {
      dVar27 = ~(-1 << (bVar15 & 0x1f));
    }
    else if (IVar8 == ISEMODE_QUINT) {
      dVar27 = (5 << (bVar15 & 0x1f)) - 1;
    }
    else {
      dVar27 = 0xffffffff;
      if (IVar8 == ISEMODE_TRIT) {
        dVar27 = (3 << (bVar15 & 0x1f)) - 1;
      }
    }
    if (dVar27 != generateBlockCaseTestData::endpointRangeMaximums[(long)local_c88])
    goto LAB_019cf640;
    uVar22 = (uint)(IVar8 == ISEMODE_QUINT) * 2 + 1;
    if (IVar8 == ISEMODE_TRIT) {
      uVar22 = 5;
    }
    uVar30 = (ulong)uVar22;
    if (IVar8 == ISEMODE_PLAIN_BIT) {
      iVar31 = 1 << (bVar15 & 0x1f);
    }
    else {
      if (IVar8 == ISEMODE_QUINT) {
        iVar31 = 5;
      }
      else {
        iVar31 = 0;
        if (IVar8 != ISEMODE_TRIT) goto LAB_019cf711;
        iVar31 = 3;
      }
      iVar31 = iVar31 << (bVar15 & 0x1f);
    }
LAB_019cf711:
    iVar9 = (iVar31 / (int)uVar10 + 1) - (uint)(iVar31 % (int)uVar10 == 0);
    local_c58 = IVar12;
    anon_unknown_0::generateDefaultISEInputs(&local_c38,&local_ce8);
    local_c38.endpoint.isGivenInBlockForm = false;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = local_c98._8_8_;
    local_c98 = auVar37 << 0x40;
    do {
      if (0 < iVar9) {
        iVar16 = 0;
        lVar13 = local_c98._0_8_;
        do {
          pNVar18 = (NormalBlockISEInputs *)0x0;
          do {
            iVar20 = ((int)lVar13 + (int)pNVar18) % iVar31;
            *(int *)((long)&local_c38.endpoint.value + (long)pNVar18 * 4) = iVar20;
            pNVar18 = (NormalBlockISEInputs *)((long)&pNVar18->weight + 1);
          } while (pNVar29 != pNVar18);
          local_ca8 = anon_unknown_0::generateNormalBlock(&local_ce8,(int)&local_c38,iVar20,pNVar18)
          ;
          anon_unknown_0::AssignBlock128::pushBytesToVector(&local_ca8,dst);
          iVar16 = iVar16 + 1;
          lVar13 = (long)&pNVar29->weight + lVar13;
        } while (iVar16 != iVar9);
      }
      lVar13 = local_c98._0_8_ + 1;
      local_c98._0_8_ = lVar13;
    } while ((uint)lVar13 != uVar22);
    IVar24 = local_c58.mode;
    if (IVar24 < ISEMODE_PLAIN_BIT) {
      anon_unknown_0::generateDefaultISEInputs(&local_c38,&local_ce8);
      local_c38.endpoint.isGivenInBlockForm = true;
      uVar25 = (uint)(IVar24 == ISEMODE_TRIT) * 0x80;
      uVar21 = (ulong)(uVar25 + 0x80);
      bVar34 = uVar10 % uVar22 != 0;
      pNVar18 = (NormalBlockISEInputs *)(ulong)bVar34;
      uVar19 = (uint)bVar34;
      uVar32 = uVar10 / uVar22 + uVar19;
      uVar10 = ((int)((long)uVar21 / (long)(int)uVar32) + 1) -
               (uint)((int)((long)uVar21 % (long)(int)uVar32) == 0);
      uVar21 = (ulong)pNVar29 % uVar30;
      local_d00 = (NormalBlockISEInputs *)0x0;
      local_c80 = uVar30;
      do {
        if (0 < (int)uVar10) {
          uVar14 = 0;
          pNVar28 = local_d00;
          do {
            iVar31 = (int)uVar21;
            local_c98._0_8_ = uVar14;
            if (0 < (int)uVar32) {
              pdVar17 = local_c38.endpoint.value.plain + 1;
              uVar21 = 0;
              do {
                memset(pdVar17,0,(ulong)(uVar22 << 2));
                pdVar17[-1] = (int)pNVar28 + (int)uVar21 & (uVar25 | 0x7f);
                uVar21 = uVar21 + 1;
                pdVar17 = pdVar17 + 6;
                iVar31 = extraout_EDX;
              } while (uVar21 < uVar32);
            }
            local_ca8 = anon_unknown_0::generateNormalBlock
                                  (&local_ce8,(int)&local_c38,iVar31,pNVar18);
            anon_unknown_0::AssignBlock128::pushBytesToVector(&local_ca8,dst);
            uVar14 = local_c98._0_8_ + 1;
            pNVar28 = (NormalBlockISEInputs *)
                      ((long)pNVar28 + (ulong)((int)((ulong)pNVar29 / uVar30) + uVar19));
            uVar21 = extraout_RDX_02;
          } while (uVar14 < uVar10);
        }
        pNVar18 = (NormalBlockISEInputs *)((long)local_d00 + 1);
        local_d00 = pNVar18;
      } while (pNVar18 != (NormalBlockISEInputs *)local_c80);
    }
    goto LAB_019cf909;
  case BLOCK_TEST_TYPE_CCS:
    local_ce8.numPartitions = 1;
    do {
      dVar27 = 0;
      local_c98._0_4_ = local_ce8.numPartitions;
      do {
        local_ce8.colorEndpointModes[3] = 0;
        local_ce8.colorEndpointModes[1] = 0;
        local_ce8.colorEndpointModes[2] = 0;
        local_ce8.weightGridWidth = 3;
        local_ce8.weightGridHeight = 3;
        local_ce8.weightISEParams.mode = ISEMODE_PLAIN_BIT;
        local_ce8.weightISEParams.numBits = 2;
        local_ce8.isDualPlane = true;
        local_ce8.ccs = dVar27;
        local_ce8.isMultiPartSingleCemMode = true;
        local_ce8.colorEndpointModes[0] = 8;
        local_ce8.partitionSeed = 0x27a;
        anon_unknown_0::generateDefaultISEInputs(&local_c38,&local_ce8);
        local_ca8 = anon_unknown_0::generateNormalBlock
                              (&local_ce8,(int)&local_c38,blockHeight_03,
                               (NormalBlockISEInputs *)iseInputs_00);
        anon_unknown_0::AssignBlock128::pushBytesToVector(&local_ca8,dst);
        dVar27 = dVar27 + 1;
        local_ce8.numPartitions = local_c98._0_4_;
      } while (dVar27 != 4);
      local_ce8.numPartitions = local_c98._0_4_ + 1;
    } while (local_ce8.numPartitions != 4);
    break;
  case BLOCK_TEST_TYPE_RANDOM:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(dst,0x40000);
    generateRandomBlocks
              ((dst->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start,0x4000,format,1);
  }
  return;
LAB_019cf640:
  IVar24 = IVar24 + uVar19;
  if (0xb < uVar25) goto code_r0x019cf656;
  goto LAB_019cf4c5;
code_r0x019cf656:
  IVar24 = local_c60.mode + ISEMODE_PLAIN_BIT;
  bVar2 = 0xb < uVar19;
  uVar19 = uVar19 + 1;
  if (bVar2) goto code_r0x019cf671;
  goto LAB_019cf4b9;
code_r0x019cf671:
  uVar30 = (long)local_c48 + 1;
  if (10 < (ulong)local_c48) goto code_r0x019cf68a;
  goto LAB_019cf48c;
code_r0x019cf68a:
  bVar2 = bVar34 != false;
  bVar34 = true;
  if (bVar2) goto code_r0x019cf69e;
  goto LAB_019cf460;
code_r0x019cf69e:
  pNVar29 = (NormalBlockISEInputs *)((long)&pNVar29->weight + 8);
  bVar34 = 3 < uVar22;
  uVar22 = uVar22 + 1;
  if (bVar34) goto LAB_019cf909;
  goto LAB_019cf43b;
LAB_019cf909:
  local_c88 = (ISEParams)((long)local_c88 + 1);
  if (local_c88 == (ISEParams)0xb) {
    return;
  }
  goto LAB_019cf417;
}

Assistant:

void generateBlockCaseTestData (vector<deUint8>& dst, CompressedTexFormat format, BlockTestType testType)
{
	DE_ASSERT(isAstcFormat(format));
	DE_ASSERT(!(isAstcSRGBFormat(format) && isBlockTestTypeHDROnly(testType)));

	const IVec3 blockSize = getBlockPixelSize(format);
	DE_ASSERT(blockSize.z() == 1);

	switch (testType)
	{
		case BLOCK_TEST_TYPE_VOID_EXTENT_LDR:
		// Generate a gradient-like set of LDR void-extent blocks.
		{
			const int			numBlocks	= 1<<13;
			const deUint32		numValues	= 1<<16;
			dst.reserve(numBlocks*BLOCK_SIZE_BYTES);

			for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			{
				const deUint32 baseValue	= blockNdx*(numValues-1) / (numBlocks-1);
				const deUint16 r			= (deUint16)((baseValue + numValues*0/4) % numValues);
				const deUint16 g			= (deUint16)((baseValue + numValues*1/4) % numValues);
				const deUint16 b			= (deUint16)((baseValue + numValues*2/4) % numValues);
				const deUint16 a			= (deUint16)((baseValue + numValues*3/4) % numValues);
				AssignBlock128 block;

				generateVoidExtentBlock(VoidExtentParams(false, r, g, b, a)).pushBytesToVector(dst);
			}

			break;
		}

		case BLOCK_TEST_TYPE_VOID_EXTENT_HDR:
		// Generate a gradient-like set of HDR void-extent blocks, with values ranging from the largest finite negative to largest finite positive of fp16.
		{
			const float		minValue	= -65504.0f;
			const float		maxValue	= +65504.0f;
			const int		numBlocks	= 1<<13;
			dst.reserve(numBlocks*BLOCK_SIZE_BYTES);

			for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			{
				const int			rNdx	= (blockNdx + numBlocks*0/4) % numBlocks;
				const int			gNdx	= (blockNdx + numBlocks*1/4) % numBlocks;
				const int			bNdx	= (blockNdx + numBlocks*2/4) % numBlocks;
				const int			aNdx	= (blockNdx + numBlocks*3/4) % numBlocks;
				const deFloat16		r		= deFloat32To16(minValue + (float)rNdx * (maxValue - minValue) / (float)(numBlocks-1));
				const deFloat16		g		= deFloat32To16(minValue + (float)gNdx * (maxValue - minValue) / (float)(numBlocks-1));
				const deFloat16		b		= deFloat32To16(minValue + (float)bNdx * (maxValue - minValue) / (float)(numBlocks-1));
				const deFloat16		a		= deFloat32To16(minValue + (float)aNdx * (maxValue - minValue) / (float)(numBlocks-1));

				generateVoidExtentBlock(VoidExtentParams(true, r, g, b, a)).pushBytesToVector(dst);
			}

			break;
		}

		case BLOCK_TEST_TYPE_WEIGHT_GRID:
		// Generate different combinations of plane count, weight ISE params, and grid size.
		{
			for (int isDualPlane = 0;		isDualPlane <= 1;												isDualPlane++)
			for (int iseParamsNdx = 0;		iseParamsNdx < DE_LENGTH_OF_ARRAY(s_weightISEParamsCandidates);	iseParamsNdx++)
			for (int weightGridWidth = 2;	weightGridWidth <= 12;											weightGridWidth++)
			for (int weightGridHeight = 2;	weightGridHeight <= 12;											weightGridHeight++)
			{
				NormalBlockParams		blockParams;
				NormalBlockISEInputs	iseInputs;

				blockParams.weightGridWidth			= weightGridWidth;
				blockParams.weightGridHeight		= weightGridHeight;
				blockParams.isDualPlane				= isDualPlane != 0;
				blockParams.weightISEParams			= s_weightISEParamsCandidates[iseParamsNdx];
				blockParams.ccs						= 0;
				blockParams.numPartitions			= 1;
				blockParams.colorEndpointModes[0]	= 0;

				if (isValidBlockParams(blockParams, blockSize.x(), blockSize.y()))
					generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), generateDefaultISEInputs(blockParams)).pushBytesToVector(dst);
			}

			break;
		}

		case BLOCK_TEST_TYPE_WEIGHT_ISE:
		// For each weight ISE param set, generate blocks that cover:
		// - each single value of the ISE's range, at each position inside an ISE block
		// - for trit and quint ISEs, each single T or Q value of an ISE block
		{
			for (int iseParamsNdx = 0;	iseParamsNdx < DE_LENGTH_OF_ARRAY(s_weightISEParamsCandidates);	iseParamsNdx++)
			{
				const ISEParams&	iseParams = s_weightISEParamsCandidates[iseParamsNdx];
				NormalBlockParams	blockParams;

				blockParams.weightGridWidth			= 4;
				blockParams.weightGridHeight		= 4;
				blockParams.weightISEParams			= iseParams;
				blockParams.numPartitions			= 1;
				blockParams.isDualPlane				= blockParams.weightGridWidth * blockParams.weightGridHeight < 24 ? true : false;
				blockParams.ccs						= 0;
				blockParams.colorEndpointModes[0]	= 0;

				while (!isValidBlockParams(blockParams, blockSize.x(), blockSize.y()))
				{
					blockParams.weightGridWidth--;
					blockParams.weightGridHeight--;
				}

				const int numValuesInISEBlock	= iseParams.mode == ISEMODE_TRIT ? 5 : iseParams.mode == ISEMODE_QUINT ? 3 : 1;
				const int numWeights			= computeNumWeights(blockParams);

				{
					const int				numWeightValues		= (int)computeISERangeMax(iseParams) + 1;
					const int				numBlocks			= deDivRoundUp32(numWeightValues, numWeights);
					NormalBlockISEInputs	iseInputs			= generateDefaultISEInputs(blockParams);
					iseInputs.weight.isGivenInBlockForm = false;

					for (int offset = 0;	offset < numValuesInISEBlock;	offset++)
					for (int blockNdx = 0;	blockNdx < numBlocks;			blockNdx++)
					{
						for (int weightNdx = 0; weightNdx < numWeights; weightNdx++)
							iseInputs.weight.value.plain[weightNdx] = (blockNdx*numWeights + weightNdx + offset) % numWeightValues;

						generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), iseInputs).pushBytesToVector(dst);
					}
				}

				if (iseParams.mode == ISEMODE_TRIT || iseParams.mode == ISEMODE_QUINT)
				{
					NormalBlockISEInputs iseInputs = generateDefaultISEInputs(blockParams);
					iseInputs.weight.isGivenInBlockForm = true;

					const int numTQValues			= 1 << (iseParams.mode == ISEMODE_TRIT ? 8 : 7);
					const int numISEBlocksPerBlock	= deDivRoundUp32(numWeights, numValuesInISEBlock);
					const int numBlocks				= deDivRoundUp32(numTQValues, numISEBlocksPerBlock);

					for (int offset = 0;	offset < numValuesInISEBlock;	offset++)
					for (int blockNdx = 0;	blockNdx < numBlocks;			blockNdx++)
					{
						for (int iseBlockNdx = 0; iseBlockNdx < numISEBlocksPerBlock; iseBlockNdx++)
						{
							for (int i = 0; i < numValuesInISEBlock; i++)
								iseInputs.weight.value.block[iseBlockNdx].bitValues[i] = 0;
							iseInputs.weight.value.block[iseBlockNdx].tOrQValue = (blockNdx*numISEBlocksPerBlock + iseBlockNdx + offset) % numTQValues;
						}

						generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), iseInputs).pushBytesToVector(dst);
					}
				}
			}

			break;
		}

		case BLOCK_TEST_TYPE_CEMS:
		// For each plane count & partition count combination, generate all color endpoint mode combinations.
		{
			for (int isDualPlane = 0;		isDualPlane <= 1;								isDualPlane++)
			for (int numPartitions = 1;		numPartitions <= (isDualPlane != 0 ? 3 : 4);	numPartitions++)
			{
				// Multi-partition, single-CEM mode.
				if (numPartitions > 1)
				{
					for (deUint32 singleCem = 0; singleCem < 16; singleCem++)
					{
						NormalBlockParams blockParams;
						blockParams.weightGridWidth				= 4;
						blockParams.weightGridHeight			= 4;
						blockParams.isDualPlane					= isDualPlane != 0;
						blockParams.ccs							= 0;
						blockParams.numPartitions				= numPartitions;
						blockParams.isMultiPartSingleCemMode	= true;
						blockParams.colorEndpointModes[0]		= singleCem;
						blockParams.partitionSeed				= 634;

						for (int iseParamsNdx = 0; iseParamsNdx < DE_LENGTH_OF_ARRAY(s_weightISEParamsCandidates); iseParamsNdx++)
						{
							blockParams.weightISEParams = s_weightISEParamsCandidates[iseParamsNdx];
							if (isValidBlockParams(blockParams, blockSize.x(), blockSize.y()))
							{
								generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), generateDefaultISEInputs(blockParams)).pushBytesToVector(dst);
								break;
							}
						}
					}
				}

				// Separate-CEM mode.
				for (deUint32 cem0 = 0; cem0 < 16; cem0++)
				for (deUint32 cem1 = 0; cem1 < (numPartitions >= 2 ? 16u : 1u); cem1++)
				for (deUint32 cem2 = 0; cem2 < (numPartitions >= 3 ? 16u : 1u); cem2++)
				for (deUint32 cem3 = 0; cem3 < (numPartitions >= 4 ? 16u : 1u); cem3++)
				{
					NormalBlockParams blockParams;
					blockParams.weightGridWidth				= 4;
					blockParams.weightGridHeight			= 4;
					blockParams.isDualPlane					= isDualPlane != 0;
					blockParams.ccs							= 0;
					blockParams.numPartitions				= numPartitions;
					blockParams.isMultiPartSingleCemMode	= false;
					blockParams.colorEndpointModes[0]		= cem0;
					blockParams.colorEndpointModes[1]		= cem1;
					blockParams.colorEndpointModes[2]		= cem2;
					blockParams.colorEndpointModes[3]		= cem3;
					blockParams.partitionSeed				= 634;

					{
						const deUint32 minCem		= *std::min_element(&blockParams.colorEndpointModes[0], &blockParams.colorEndpointModes[numPartitions]);
						const deUint32 maxCem		= *std::max_element(&blockParams.colorEndpointModes[0], &blockParams.colorEndpointModes[numPartitions]);
						const deUint32 minCemClass	= minCem/4;
						const deUint32 maxCemClass	= maxCem/4;

						if (maxCemClass - minCemClass > 1)
							continue;
					}

					for (int iseParamsNdx = 0; iseParamsNdx < DE_LENGTH_OF_ARRAY(s_weightISEParamsCandidates); iseParamsNdx++)
					{
						blockParams.weightISEParams = s_weightISEParamsCandidates[iseParamsNdx];
						if (isValidBlockParams(blockParams, blockSize.x(), blockSize.y()))
						{
							generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), generateDefaultISEInputs(blockParams)).pushBytesToVector(dst);
							break;
						}
					}
				}
			}

			break;
		}

		case BLOCK_TEST_TYPE_PARTITION_SEED:
		// Test all partition seeds ("partition pattern indices").
		{
			for (int		numPartitions = 2;	numPartitions <= 4;		numPartitions++)
			for (deUint32	partitionSeed = 0;	partitionSeed < 1<<10;	partitionSeed++)
			{
				NormalBlockParams blockParams;
				blockParams.weightGridWidth				= 4;
				blockParams.weightGridHeight			= 4;
				blockParams.weightISEParams				= ISEParams(ISEMODE_PLAIN_BIT, 2);
				blockParams.isDualPlane					= false;
				blockParams.numPartitions				= numPartitions;
				blockParams.isMultiPartSingleCemMode	= true;
				blockParams.colorEndpointModes[0]		= 0;
				blockParams.partitionSeed				= partitionSeed;

				generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), generateDefaultISEInputs(blockParams)).pushBytesToVector(dst);
			}

			break;
		}

		// \note Fall-through.
		case BLOCK_TEST_TYPE_ENDPOINT_VALUE_LDR:
		case BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_NO_15:
		case BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_15:
		// For each endpoint mode, for each pair of components in the endpoint value, test 10x10 combinations of values for that pair.
		// \note Separate modes for HDR and mode 15 due to different color scales and biases.
		{
			for (deUint32 cem = 0; cem < 16; cem++)
			{
				const bool isHDRCem = cem == 2		||
									  cem == 3		||
									  cem == 7		||
									  cem == 11		||
									  cem == 14		||
									  cem == 15;

				if ((testType == BLOCK_TEST_TYPE_ENDPOINT_VALUE_LDR			&& isHDRCem)					||
					(testType == BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_NO_15		&& (!isHDRCem || cem == 15))	||
					(testType == BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_15		&& cem != 15))
					continue;

				NormalBlockParams blockParams;
				blockParams.weightGridWidth			= 3;
				blockParams.weightGridHeight		= 4;
				blockParams.weightISEParams			= ISEParams(ISEMODE_PLAIN_BIT, 2);
				blockParams.isDualPlane				= false;
				blockParams.numPartitions			= 1;
				blockParams.colorEndpointModes[0]	= cem;

				{
					const int			numBitsForEndpoints		= computeNumBitsForColorEndpoints(blockParams);
					const int			numEndpointParts		= computeNumColorEndpointValues(cem);
					const ISEParams		endpointISE				= computeMaximumRangeISEParams(numBitsForEndpoints, numEndpointParts);
					const int			endpointISERangeMax		= computeISERangeMax(endpointISE);

					for (int endpointPartNdx0 = 0;						endpointPartNdx0 < numEndpointParts; endpointPartNdx0++)
					for (int endpointPartNdx1 = endpointPartNdx0+1;		endpointPartNdx1 < numEndpointParts; endpointPartNdx1++)
					{
						NormalBlockISEInputs	iseInputs			= generateDefaultISEInputs(blockParams);
						const int				numEndpointValues	= de::min(10, endpointISERangeMax+1);

						for (int endpointValueNdx0 = 0; endpointValueNdx0 < numEndpointValues; endpointValueNdx0++)
						for (int endpointValueNdx1 = 0; endpointValueNdx1 < numEndpointValues; endpointValueNdx1++)
						{
							const int endpointValue0 = endpointValueNdx0 * endpointISERangeMax / (numEndpointValues-1);
							const int endpointValue1 = endpointValueNdx1 * endpointISERangeMax / (numEndpointValues-1);

							iseInputs.endpoint.value.plain[endpointPartNdx0] = endpointValue0;
							iseInputs.endpoint.value.plain[endpointPartNdx1] = endpointValue1;

							generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), iseInputs).pushBytesToVector(dst);
						}
					}
				}
			}

			break;
		}

		case BLOCK_TEST_TYPE_ENDPOINT_ISE:
		// Similar to BLOCK_TEST_TYPE_WEIGHT_ISE, see above.
		{
			static const deUint32 endpointRangeMaximums[] = { 5, 9, 11, 19, 23, 39, 47, 79, 95, 159, 191 };

			for (int endpointRangeNdx = 0; endpointRangeNdx < DE_LENGTH_OF_ARRAY(endpointRangeMaximums); endpointRangeNdx++)
			{
				bool validCaseGenerated = false;

				for (int numPartitions = 1;			!validCaseGenerated && numPartitions <= 4;														numPartitions++)
				for (int isDual = 0;				!validCaseGenerated && isDual <= 1;																isDual++)
				for (int weightISEParamsNdx = 0;	!validCaseGenerated && weightISEParamsNdx < DE_LENGTH_OF_ARRAY(s_weightISEParamsCandidates);	weightISEParamsNdx++)
				for (int weightGridWidth = 2;		!validCaseGenerated && weightGridWidth <= 12;													weightGridWidth++)
				for (int weightGridHeight = 2;		!validCaseGenerated && weightGridHeight <= 12;													weightGridHeight++)
				{
					NormalBlockParams blockParams;
					blockParams.weightGridWidth				= weightGridWidth;
					blockParams.weightGridHeight			= weightGridHeight;
					blockParams.weightISEParams				= s_weightISEParamsCandidates[weightISEParamsNdx];
					blockParams.isDualPlane					= isDual != 0;
					blockParams.ccs							= 0;
					blockParams.numPartitions				= numPartitions;
					blockParams.isMultiPartSingleCemMode	= true;
					blockParams.colorEndpointModes[0]		= 12;
					blockParams.partitionSeed				= 634;

					if (isValidBlockParams(blockParams, blockSize.x(), blockSize.y()))
					{
						const ISEParams endpointISEParams = computeMaximumRangeISEParams(computeNumBitsForColorEndpoints(blockParams),
																						 computeNumColorEndpointValues(&blockParams.colorEndpointModes[0], numPartitions, true));

						if (computeISERangeMax(endpointISEParams) == endpointRangeMaximums[endpointRangeNdx])
						{
							validCaseGenerated = true;

							const int numColorEndpoints		= computeNumColorEndpointValues(&blockParams.colorEndpointModes[0], numPartitions, blockParams.isMultiPartSingleCemMode);
							const int numValuesInISEBlock	= endpointISEParams.mode == ISEMODE_TRIT ? 5 : endpointISEParams.mode == ISEMODE_QUINT ? 3 : 1;

							{
								const int				numColorEndpointValues	= (int)computeISERangeMax(endpointISEParams) + 1;
								const int				numBlocks				= deDivRoundUp32(numColorEndpointValues, numColorEndpoints);
								NormalBlockISEInputs	iseInputs				= generateDefaultISEInputs(blockParams);
								iseInputs.endpoint.isGivenInBlockForm = false;

								for (int offset = 0;	offset < numValuesInISEBlock;	offset++)
								for (int blockNdx = 0;	blockNdx < numBlocks;			blockNdx++)
								{
									for (int endpointNdx = 0; endpointNdx < numColorEndpoints; endpointNdx++)
										iseInputs.endpoint.value.plain[endpointNdx] = (blockNdx*numColorEndpoints + endpointNdx + offset) % numColorEndpointValues;

									generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), iseInputs).pushBytesToVector(dst);
								}
							}

							if (endpointISEParams.mode == ISEMODE_TRIT || endpointISEParams.mode == ISEMODE_QUINT)
							{
								NormalBlockISEInputs iseInputs = generateDefaultISEInputs(blockParams);
								iseInputs.endpoint.isGivenInBlockForm = true;

								const int numTQValues			= 1 << (endpointISEParams.mode == ISEMODE_TRIT ? 8 : 7);
								const int numISEBlocksPerBlock	= deDivRoundUp32(numColorEndpoints, numValuesInISEBlock);
								const int numBlocks				= deDivRoundUp32(numTQValues, numISEBlocksPerBlock);

								for (int offset = 0;	offset < numValuesInISEBlock;	offset++)
								for (int blockNdx = 0;	blockNdx < numBlocks;			blockNdx++)
								{
									for (int iseBlockNdx = 0; iseBlockNdx < numISEBlocksPerBlock; iseBlockNdx++)
									{
										for (int i = 0; i < numValuesInISEBlock; i++)
											iseInputs.endpoint.value.block[iseBlockNdx].bitValues[i] = 0;
										iseInputs.endpoint.value.block[iseBlockNdx].tOrQValue = (blockNdx*numISEBlocksPerBlock + iseBlockNdx + offset) % numTQValues;
									}

									generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), iseInputs).pushBytesToVector(dst);
								}
							}
						}
					}
				}

				DE_ASSERT(validCaseGenerated);
			}

			break;
		}

		case BLOCK_TEST_TYPE_CCS:
		// For all partition counts, test all values of the CCS (color component selector).
		{
			for (int		numPartitions = 1;		numPartitions <= 3;		numPartitions++)
			for (deUint32	ccs = 0;				ccs < 4;				ccs++)
			{
				NormalBlockParams blockParams;
				blockParams.weightGridWidth				= 3;
				blockParams.weightGridHeight			= 3;
				blockParams.weightISEParams				= ISEParams(ISEMODE_PLAIN_BIT, 2);
				blockParams.isDualPlane					= true;
				blockParams.ccs							= ccs;
				blockParams.numPartitions				= numPartitions;
				blockParams.isMultiPartSingleCemMode	= true;
				blockParams.colorEndpointModes[0]		= 8;
				blockParams.partitionSeed				= 634;

				generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), generateDefaultISEInputs(blockParams)).pushBytesToVector(dst);
			}

			break;
		}

		case BLOCK_TEST_TYPE_RANDOM:
		// Generate a number of random (including invalid) blocks.
		{
			const int		numBlocks	= 16384;
			const deUint32	seed		= 1;

			dst.resize(numBlocks*BLOCK_SIZE_BYTES);

			generateRandomBlocks(&dst[0], numBlocks, format, seed);

			break;
		}

		default:
			DE_ASSERT(false);
	}
}